

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O2

void __thiscall
btConeTwistConstraint::getInfo2NonVirtual
          (btConeTwistConstraint *this,btConstraintInfo2 *info,btTransform *transA,
          btTransform *transB,btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  btVector3 *pbVar4;
  btScalar *pbVar5;
  btScalar *pbVar6;
  btScalar *pbVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  float fVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  btVector3 bVar15;
  btVector3 a2;
  btVector3 a1;
  btVector3 a1neg;
  btVector3 local_90;
  btScalar local_80 [4];
  btTransform local_70;
  
  calcAngleInfo2(this,transA,transB,invInertiaWorldA,invInertiaWorldB);
  pbVar7 = info->m_J1linearAxis;
  *pbVar7 = 1.0;
  iVar10 = info->rowskip;
  pbVar7[(long)iVar10 + 1] = 1.0;
  pbVar7[(long)iVar10 * 2 + 2] = 1.0;
  local_80 = (btScalar  [4])operator*(&transA->m_basis,&(this->m_rbAFrame).m_origin);
  pbVar4 = (btVector3 *)info->m_J1angularAxis;
  local_70.m_basis.m_el[0].m_floats._0_8_ = local_80._0_8_ ^ 0x8000000080000000;
  local_70.m_basis.m_el[0].m_floats[2] = -local_80[2];
  local_70.m_basis.m_el[0].m_floats[3] = 0.0;
  btVector3::getSkewSymmetricMatrix
            ((btVector3 *)&local_70,pbVar4,(btVector3 *)(pbVar4->m_floats + info->rowskip),
             (btVector3 *)(pbVar4->m_floats + (long)info->rowskip * 2));
  pbVar7 = info->m_J2linearAxis;
  *pbVar7 = -1.0;
  iVar10 = info->rowskip;
  pbVar7[(long)iVar10 + 1] = -1.0;
  pbVar7[(long)iVar10 * 2 + 2] = -1.0;
  local_90 = operator*(&transB->m_basis,&(this->m_rbBFrame).m_origin);
  pbVar4 = (btVector3 *)info->m_J2angularAxis;
  btVector3::getSkewSymmetricMatrix
            (&local_90,pbVar4,(btVector3 *)(pbVar4->m_floats + info->rowskip),
             (btVector3 *)(pbVar4->m_floats + (long)info->rowskip * 2));
  uVar2 = this->m_flags;
  pbVar7 = &this->m_linERP;
  if ((uVar2 & 2) == 0) {
    pbVar7 = &info->erp;
  }
  fVar14 = *pbVar7;
  fVar11 = info->fps;
  pbVar7 = info->m_constraintError;
  pbVar5 = info->m_lowerLimit;
  iVar10 = info->rowskip;
  pbVar6 = info->m_upperLimit;
  lVar8 = 0;
  for (lVar9 = 0; lVar9 != 0xc; lVar9 = lVar9 + 4) {
    pbVar7[lVar8] =
         (((*(float *)((long)local_90.m_floats + lVar9) +
           *(float *)((long)(transB->m_origin).m_floats + lVar9)) -
          *(float *)((long)local_80 + lVar9)) -
         *(float *)((long)(transA->m_origin).m_floats + lVar9)) * fVar14 * fVar11;
    pbVar5[lVar8] = -3.4028235e+38;
    pbVar6[lVar8] = 3.4028235e+38;
    if ((uVar2 & 1) != 0) {
      info->cfm[lVar8] = this->m_linCFM;
    }
    lVar8 = lVar8 + iVar10;
  }
  iVar10 = iVar10 * 3;
  if (this->m_solveSwingLimit == true) {
    pbVar7 = info->m_J1angularAxis;
    pbVar5 = info->m_J2angularAxis;
    fVar14 = this->m_fixThresh;
    if ((fVar14 < this->m_swingSpan1 || fVar14 == this->m_swingSpan1) ||
       (fVar14 < this->m_swingSpan2 || fVar14 == this->m_swingSpan2)) {
      bVar15 = operator*(&this->m_swingAxis,&this->m_relaxationFactor);
      fVar14 = this->m_relaxationFactor;
      fVar13 = fVar14 * bVar15.m_floats[0];
      fVar11 = bVar15.m_floats[1] * fVar14;
      fVar14 = fVar14 * bVar15.m_floats[2];
      pbVar7[iVar10] = fVar13;
      pbVar7[(long)iVar10 + 1] = fVar11;
      pbVar7[(long)iVar10 + 2] = fVar14;
      pbVar5[iVar10] = -fVar13;
      pbVar5[(long)iVar10 + 1] = -fVar11;
      pbVar5[(long)iVar10 + 2] = -fVar14;
      info->m_constraintError[iVar10] = info->fps * this->m_biasFactor * this->m_swingCorrection;
      if ((this->m_flags & 4) != 0) {
        info->cfm[iVar10] = this->m_angCFM;
      }
      info->m_lowerLimit[iVar10] = 0.0;
      fVar14 = 3.4028235e+38;
      if ((this->m_bMotorEnabled == true) && (0.0 <= this->m_maxMotorImpulse)) {
        fVar14 = this->m_maxMotorImpulse;
      }
      info->m_upperLimit[iVar10] = fVar14;
      iVar10 = iVar10 + info->rowskip;
    }
    else {
      btTransform::operator*(&local_70,transA,&this->m_rbAFrame);
      iVar3 = info->rowskip;
      iVar1 = iVar3 + iVar10;
      pbVar7[iVar10] = local_70.m_basis.m_el[0].m_floats[1];
      pbVar7[(long)iVar10 + 1] = local_70.m_basis.m_el[1].m_floats[1];
      pbVar7[(long)iVar10 + 2] = local_70.m_basis.m_el[2].m_floats[1];
      pbVar7[iVar1] = local_70.m_basis.m_el[0].m_floats[2];
      pbVar7[(long)iVar1 + 1] = local_70.m_basis.m_el[1].m_floats[2];
      pbVar7[(long)iVar1 + 2] = local_70.m_basis.m_el[2].m_floats[2];
      pbVar5[iVar10] = -local_70.m_basis.m_el[0].m_floats[1];
      pbVar5[(long)iVar10 + 1] = -local_70.m_basis.m_el[1].m_floats[1];
      pbVar5[(long)iVar10 + 2] = -local_70.m_basis.m_el[2].m_floats[1];
      pbVar5[iVar1] = -local_70.m_basis.m_el[0].m_floats[2];
      pbVar5[(long)iVar1 + 1] = -local_70.m_basis.m_el[1].m_floats[2];
      pbVar5[(long)iVar1 + 2] = -local_70.m_basis.m_el[2].m_floats[2];
      fVar14 = info->fps * this->m_relaxationFactor;
      pbVar7 = info->m_constraintError;
      pbVar7[iVar10] =
           (local_70.m_basis.m_el[2].m_floats[1] * (this->m_swingAxis).m_floats[2] +
           local_70.m_basis.m_el[0].m_floats[1] * (this->m_swingAxis).m_floats[0] +
           local_70.m_basis.m_el[1].m_floats[1] * (this->m_swingAxis).m_floats[1]) * fVar14;
      pbVar7[iVar1] =
           (local_70.m_basis.m_el[2].m_floats[2] * (this->m_swingAxis).m_floats[2] +
           local_70.m_basis.m_el[0].m_floats[2] * (this->m_swingAxis).m_floats[0] +
           local_70.m_basis.m_el[1].m_floats[2] * (this->m_swingAxis).m_floats[1]) * fVar14;
      pbVar7 = info->m_lowerLimit;
      pbVar7[iVar10] = -3.4028235e+38;
      pbVar5 = info->m_upperLimit;
      pbVar5[iVar10] = 3.4028235e+38;
      pbVar7[iVar1] = -3.4028235e+38;
      pbVar5[iVar1] = 3.4028235e+38;
      iVar10 = iVar1 + iVar3;
    }
  }
  if (this->m_solveTwistLimit != true) {
    return;
  }
  bVar15 = operator*(&this->m_twistAxis,&this->m_relaxationFactor);
  fVar14 = this->m_relaxationFactor;
  fVar13 = fVar14 * bVar15.m_floats[0];
  fVar11 = bVar15.m_floats[1] * fVar14;
  fVar14 = fVar14 * bVar15.m_floats[2];
  pbVar7 = info->m_J1angularAxis;
  pbVar5 = info->m_J2angularAxis;
  lVar8 = (long)iVar10;
  pbVar7[lVar8] = fVar13;
  pbVar7[lVar8 + 1] = fVar11;
  pbVar7[lVar8 + 2] = fVar14;
  pbVar5[lVar8] = -fVar13;
  pbVar5[lVar8 + 1] = -fVar11;
  pbVar5[lVar8 + 2] = -fVar14;
  info->m_constraintError[lVar8] = info->fps * this->m_biasFactor * this->m_twistCorrection;
  if ((this->m_flags & 4) != 0) {
    info->cfm[lVar8] = this->m_angCFM;
  }
  bVar12 = 0.0;
  if (this->m_twistSpan <= 0.0) {
    info->m_lowerLimit[lVar8] = -3.4028235e+38;
  }
  else {
    if (this->m_twistCorrection <= 0.0) {
      info->m_lowerLimit[lVar8] = -3.4028235e+38;
      goto LAB_0016c394;
    }
    info->m_lowerLimit[lVar8] = 0.0;
  }
  bVar12 = 3.4028235e+38;
LAB_0016c394:
  info->m_upperLimit[lVar8] = bVar12;
  return;
}

Assistant:

void btConeTwistConstraint::getInfo2NonVirtual (btConstraintInfo2* info,const btTransform& transA,const btTransform& transB,const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	calcAngleInfo2(transA,transB,invInertiaWorldA,invInertiaWorldB);
	
	btAssert(!m_useSolveConstraintObsolete);
    // set jacobian
    info->m_J1linearAxis[0] = 1;
    info->m_J1linearAxis[info->rowskip+1] = 1;
    info->m_J1linearAxis[2*info->rowskip+2] = 1;
	btVector3 a1 = transA.getBasis() * m_rbAFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J1angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J1angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J1angularAxis+2*info->rowskip);
		btVector3 a1neg = -a1;
		a1neg.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    info->m_J2linearAxis[0] = -1;
    info->m_J2linearAxis[info->rowskip+1] = -1;
    info->m_J2linearAxis[2*info->rowskip+2] = -1;
	btVector3 a2 = transB.getBasis() * m_rbBFrame.getOrigin();
	{
		btVector3* angular0 = (btVector3*)(info->m_J2angularAxis);
		btVector3* angular1 = (btVector3*)(info->m_J2angularAxis+info->rowskip);
		btVector3* angular2 = (btVector3*)(info->m_J2angularAxis+2*info->rowskip);
		a2.getSkewSymmetricMatrix(angular0,angular1,angular2);
	}
    // set right hand side
	btScalar linERP = (m_flags & BT_CONETWIST_FLAGS_LIN_ERP) ? m_linERP : info->erp;
    btScalar k = info->fps * linERP;
    int j;
	for (j=0; j<3; j++)
    {
        info->m_constraintError[j*info->rowskip] = k * (a2[j] + transB.getOrigin()[j] - a1[j] - transA.getOrigin()[j]);
		info->m_lowerLimit[j*info->rowskip] = -SIMD_INFINITY;
		info->m_upperLimit[j*info->rowskip] = SIMD_INFINITY;
		if(m_flags & BT_CONETWIST_FLAGS_LIN_CFM)
		{
			info->cfm[j*info->rowskip] = m_linCFM;
		}
    }
	int row = 3;
    int srow = row * info->rowskip;
	btVector3 ax1;
	// angular limits
	if(m_solveSwingLimit)
	{
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
		{
			btTransform trA = transA*m_rbAFrame;
			btVector3 p = trA.getBasis().getColumn(1);
			btVector3 q = trA.getBasis().getColumn(2);
			int srow1 = srow + info->rowskip;
			J1[srow+0] = p[0];
			J1[srow+1] = p[1];
			J1[srow+2] = p[2];
			J1[srow1+0] = q[0];
			J1[srow1+1] = q[1];
			J1[srow1+2] = q[2];
			J2[srow+0] = -p[0];
			J2[srow+1] = -p[1];
			J2[srow+2] = -p[2];
			J2[srow1+0] = -q[0];
			J2[srow1+1] = -q[1];
			J2[srow1+2] = -q[2];
			btScalar fact = info->fps * m_relaxationFactor;
			info->m_constraintError[srow] =   fact * m_swingAxis.dot(p);
			info->m_constraintError[srow1] =  fact * m_swingAxis.dot(q);
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
			info->m_lowerLimit[srow1] = -SIMD_INFINITY;
			info->m_upperLimit[srow1] = SIMD_INFINITY;
			srow = srow1 + info->rowskip;
		}
		else
		{
			ax1 = m_swingAxis * m_relaxationFactor * m_relaxationFactor;
			J1[srow+0] = ax1[0];
			J1[srow+1] = ax1[1];
			J1[srow+2] = ax1[2];
			J2[srow+0] = -ax1[0];
			J2[srow+1] = -ax1[1];
			J2[srow+2] = -ax1[2];
			btScalar k = info->fps * m_biasFactor;

			info->m_constraintError[srow] = k * m_swingCorrection;
			if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
			{
				info->cfm[srow] = m_angCFM;
			}
			// m_swingCorrection is always positive or 0
			info->m_lowerLimit[srow] = 0;
			info->m_upperLimit[srow] = (m_bMotorEnabled && m_maxMotorImpulse >= 0.0f) ? m_maxMotorImpulse : SIMD_INFINITY;
			srow += info->rowskip;
		}
	}
	if(m_solveTwistLimit)
	{
		ax1 = m_twistAxis * m_relaxationFactor * m_relaxationFactor;
		btScalar *J1 = info->m_J1angularAxis;
		btScalar *J2 = info->m_J2angularAxis;
		J1[srow+0] = ax1[0];
		J1[srow+1] = ax1[1];
		J1[srow+2] = ax1[2];
		J2[srow+0] = -ax1[0];
		J2[srow+1] = -ax1[1];
		J2[srow+2] = -ax1[2];
		btScalar k = info->fps * m_biasFactor;
		info->m_constraintError[srow] = k * m_twistCorrection;
		if(m_flags & BT_CONETWIST_FLAGS_ANG_CFM)
		{
			info->cfm[srow] = m_angCFM;
		}
		if(m_twistSpan > 0.0f)
		{

			if(m_twistCorrection > 0.0f)
			{
				info->m_lowerLimit[srow] = 0;
				info->m_upperLimit[srow] = SIMD_INFINITY;
			} 
			else
			{
				info->m_lowerLimit[srow] = -SIMD_INFINITY;
				info->m_upperLimit[srow] = 0;
			} 
		}
		else
		{
			info->m_lowerLimit[srow] = -SIMD_INFINITY;
			info->m_upperLimit[srow] = SIMD_INFINITY;
		}
		srow += info->rowskip;
	}
}